

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
::LookupBucketFor<llvm::MCRegister>
          (DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
           *this,MCRegister *Val,DenseMapPair<llvm::MCRegister,_int> **FoundBucket)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  DenseMapPair<llvm::MCRegister,_int> *pDVar5;
  MCRegister *pMVar6;
  DenseMapPair<llvm::MCRegister,_int> *local_78;
  DenseMapPair<llvm::MCRegister,_int> *ThisBucket;
  uint ProbeAmt;
  uint BucketNo;
  MCRegister TombstoneKey;
  MCRegister EmptyKey;
  DenseMapPair<llvm::MCRegister,_int> *FoundTombstone;
  uint NumBuckets;
  DenseMapPair<llvm::MCRegister,_int> *BucketsPtr;
  DenseMapPair<llvm::MCRegister,_int> **FoundBucket_local;
  MCRegister *Val_local;
  DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
  *this_local;
  
  pDVar5 = getBuckets(this);
  uVar3 = getNumBuckets(this);
  if (uVar3 == 0) {
    *FoundBucket = (DenseMapPair<llvm::MCRegister,_int> *)0x0;
    this_local._7_1_ = false;
  }
  else {
    _TombstoneKey = (DenseMapPair<llvm::MCRegister,_int> *)0x0;
    BucketNo = (uint)getEmptyKey();
    ProbeAmt = (uint)getTombstoneKey();
    bVar1 = DenseMapInfo<llvm::MCRegister>::isEqual(Val,(MCRegister *)&BucketNo);
    bVar2 = false;
    if (!bVar1) {
      bVar1 = DenseMapInfo<llvm::MCRegister>::isEqual(Val,(MCRegister *)&ProbeAmt);
      bVar2 = false;
      if (!bVar1) {
        bVar2 = true;
      }
    }
    if (!bVar2) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                    ,0x252,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llvm::MCRegister, int>, llvm::MCRegister, int, llvm::DenseMapInfo<MCRegister>, llvm::detail::DenseMapPair<llvm::MCRegister, int>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llvm::MCRegister, int>, KeyT = llvm::MCRegister, ValueT = int, KeyInfoT = llvm::DenseMapInfo<MCRegister>, BucketT = llvm::detail::DenseMapPair<llvm::MCRegister, int>, LookupKeyT = llvm::MCRegister]"
                   );
    }
    uVar4 = getHashValue(Val);
    ThisBucket._4_4_ = uVar4 & uVar3 - 1;
    ThisBucket._0_4_ = 1;
    while( true ) {
      local_78 = pDVar5 + ThisBucket._4_4_;
      pMVar6 = detail::DenseMapPair<llvm::MCRegister,_int>::getFirst(local_78);
      bVar2 = DenseMapInfo<llvm::MCRegister>::isEqual(Val,pMVar6);
      if (bVar2) break;
      pMVar6 = detail::DenseMapPair<llvm::MCRegister,_int>::getFirst(local_78);
      bVar2 = DenseMapInfo<llvm::MCRegister>::isEqual(pMVar6,(MCRegister *)&BucketNo);
      if (bVar2) {
        if (_TombstoneKey != (DenseMapPair<llvm::MCRegister,_int> *)0x0) {
          local_78 = _TombstoneKey;
        }
        *FoundBucket = local_78;
        return false;
      }
      pMVar6 = detail::DenseMapPair<llvm::MCRegister,_int>::getFirst(local_78);
      bVar2 = DenseMapInfo<llvm::MCRegister>::isEqual(pMVar6,(MCRegister *)&ProbeAmt);
      if ((bVar2) && (_TombstoneKey == (DenseMapPair<llvm::MCRegister,_int> *)0x0)) {
        _TombstoneKey = local_78;
      }
      ThisBucket._4_4_ = uVar3 - 1 & (int)ThisBucket + ThisBucket._4_4_;
      ThisBucket._0_4_ = (int)ThisBucket + 1;
    }
    *FoundBucket = local_78;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }